

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

void __thiscall flatbuffers::ts::TsGenerator::generateEnums(TsGenerator *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
  *this_00;
  EnumDef *enum_def_00;
  bool bVar1;
  reference ppEVar2;
  string local_f8;
  undefined1 local_d8 [8];
  string type_name;
  EnumDef *enum_def;
  string enumcode;
  import_set imports;
  import_set bare_imports;
  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_18;
  const_iterator it;
  TsGenerator *this_local;
  
  it._M_current = (EnumDef **)this;
  local_18._M_current =
       (EnumDef **)
       std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->enums_).vec);
  while( true ) {
    bare_imports._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                           (&(((this->super_BaseGenerator).parser_)->enums_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                        *)&bare_imports._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (!bVar1) break;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
           *)&imports._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
               *)((long)&enumcode.field_2 + 8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
    ::map(this_00);
    std::__cxx11::string::string((string *)&enum_def);
    ppEVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_18);
    enum_def_00 = *ppEVar2;
    GenEnum(this,enum_def_00,(string *)&enum_def,this_00,false);
    GenEnum(this,enum_def_00,(string *)&enum_def,(import_set *)((long)&enumcode.field_2 + 8),true);
    GetTypeName_abi_cxx11_((string *)local_d8,this,enum_def_00,false,false);
    std::__cxx11::string::string((string *)&local_f8,(string *)local_d8);
    TrackNsDef(this,&enum_def_00->super_Definition,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    SaveType(this,&enum_def_00->super_Definition,(string *)&enum_def,
             (import_set *)((long)&enumcode.field_2 + 8),
             (import_set *)&imports._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)&enum_def);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
            *)((long)&enumcode.field_2 + 8));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
            *)&imports._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void generateEnums() {
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      import_set bare_imports;
      import_set imports;
      std::string enumcode;
      auto &enum_def = **it;
      GenEnum(enum_def, &enumcode, imports, false);
      GenEnum(enum_def, &enumcode, imports, true);
      std::string type_name = GetTypeName(enum_def);
      TrackNsDef(enum_def, type_name);
      SaveType(enum_def, enumcode, imports, bare_imports);
    }
  }